

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ExprPtr __thiscall mathiu::impl::substitute(impl *this,ExprPtr *ex,ExprPtr *srcDstPairs)

{
  InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *pattern;
  InternalPatternT<matchit::impl::Id<mathiu::impl::Pair>_> *pIVar1;
  element_type *peVar2;
  element_type **ppeVar3;
  bool bVar4;
  IdProcess IVar5;
  variant_alternative_t<1UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value;
  Set *pSVar6;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *ppVar7;
  _Base_ptr p_Var8;
  variant_alternative_t<2UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value_00;
  Pair *__a;
  Pair *pPVar9;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar10;
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_4e8;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_4c8;
  ContextT context;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_448;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_428;
  undefined1 local_3f0 [16];
  _Base_ptr local_3e0;
  _Base_ptr local_3d8;
  _Base_ptr local_3d0;
  size_t local_3c8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_3c0;
  Id<mathiu::impl::Pair> *local_368;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_360;
  Id<mathiu::impl::Set> *local_2f8;
  RetType_conflict5 subMap;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_2c0;
  Id<mathiu::impl::Pair> iPair;
  insert_iterator<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_250;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_240;
  Id<mathiu::impl::Set> iSet;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_1b0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_158;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_100;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_98;
  
  matchit::impl::Id<mathiu::impl::Set>::Id(&iSet);
  matchit::impl::Id<mathiu::impl::Pair>::Id(&iPair);
  peVar2 = (srcDstPairs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  matchit::impl::Id<mathiu::impl::Set>::Id((Id<mathiu::impl::Set> *)&local_240,&iSet);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_100,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,
             (Id<mathiu::impl::Set> *)&local_240);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::App(&local_98,&local_100);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::App(&local_360,&local_98);
  local_2f8 = &iSet;
  matchit::impl::Id<mathiu::impl::Pair>::Id((Id<mathiu::impl::Pair> *)&local_2c0,&iPair);
  matchit::impl::as<mathiu::impl::Pair>::{lambda(auto:1)#1}::operator()
            (&local_1b0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Pair>,
             (Id<mathiu::impl::Pair> *)&local_2c0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  ::App(&local_158,&local_1b0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  ::App(&local_3c0,&local_158);
  local_428._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_428._M_impl.super__Rb_tree_header._M_header;
  local_428._M_impl._0_8_ = 0;
  local_428._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_428._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_428._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_428._M_impl.super__Rb_tree_header._M_node_count = 0;
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[3].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[2].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[1].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._9_7_ = 0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
           )0x0;
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._M_index = '\0';
  context.mMemHolder._M_elems[0].
  super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>.
  super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  .
  super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  ._9_7_ = 0;
  context.mSize = 0;
  local_428._M_impl.super__Rb_tree_header._M_header._M_right =
       local_428._M_impl.super__Rb_tree_header._M_header._M_left;
  local_368 = &iPair;
  matchit::impl::Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool>::Context
            (&context);
  local_3f0._0_8_ = (element_type *)0x0;
  if (*(__index_type *)
       ((long)&(peVar2->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\r') {
    local_3f0._0_8_ = peVar2;
  }
  matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>::
  emplace_back<mathiu::impl::Set_const*>
            ((Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool> *)&context,
             (Set **)local_3f0);
  value = std::get<1ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                    (context.mMemHolder._M_elems + (context.mSize - 1));
  bVar4 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Set_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                    (value,&local_360.mPattern.mPatterns.
                            super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                            .
                            super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                            ._M_head_impl,2,&context);
  if (bVar4) {
    pattern = (InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
              ((long)&local_360.mPattern.mPatterns.
                      super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                      .
                      super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                      .
                      super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
              + 8);
    bVar4 = matchit::impl::
            matchPattern<mathiu::impl::Set_const&,matchit::impl::Id<mathiu::impl::Set>,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                      (*value,pattern,3,&context);
    IVar5 = (IdProcess)bVar4;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              (pattern,2,(uint)bVar4);
  }
  else {
    IVar5 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_360.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8),1,IVar5);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_360.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8),0,IVar5);
  if (IVar5 == kCANCEL) {
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[3].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[2].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[1].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._9_7_ = 0;
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
             )0x0;
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._M_index = '\0';
    context.mMemHolder._M_elems[0].
    super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    .
    super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
    ._9_7_ = 0;
    context.mSize = 0;
    matchit::impl::Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool>::
    Context(&context);
    local_3f0._0_8_ = (element_type *)0x0;
    if (*(__index_type *)
         ((long)&(peVar2->super_ExprVariant).
                 super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                 .
                 super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
         + 0x38) == '\x11') {
      local_3f0._0_8_ = peVar2;
    }
    matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>::
    emplace_back<mathiu::impl::Pair_const*>
              ((Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool> *)&context,
               (Pair **)local_3f0);
    value_00 = std::get<2ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                         (context.mMemHolder._M_elems + (context.mSize - 1));
    bVar4 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<mathiu::impl::Pair_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                      (value_00,&local_3c0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
                                 ._M_head_impl,2,&context);
    if (bVar4) {
      pIVar1 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Pair>_> *)
               ((long)&local_3c0.mPattern.mPatterns.
                       super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                       .
                       super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                       .
                       super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
               + 8);
      bVar4 = matchit::impl::
              matchPattern<mathiu::impl::Pair_const&,matchit::impl::Id<mathiu::impl::Pair>,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                        (*value_00,pIVar1,3,&context);
      IVar5 = (IdProcess)bVar4;
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
                (pIVar1,2,(uint)bVar4);
    }
    else {
      IVar5 = kCANCEL;
    }
    pIVar1 = (InternalPatternT<matchit::impl::Id<mathiu::impl::Pair>_> *)
             ((long)&local_3c0.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
             + 8);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              (pIVar1,1,IVar5);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              (pIVar1,0,IVar5);
    if (IVar5 == kCANCEL) {
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[3].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[2].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[1].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._9_7_ = 0;
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_u = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._M_index = '\0';
      context.mMemHolder._M_elems[0].
      super__Variant_base<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_assign_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Move_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Copy_ctor_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      .
      super__Variant_storage_alias<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
      ._9_7_ = 0;
      context.mSize = 0;
      matchit::impl::Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool>::
      Context(&context);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Mismatch in substitute!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __a = matchit::impl::Id<mathiu::impl::Pair>::get(local_368);
    pPVar9 = matchit::impl::Id<mathiu::impl::Pair>::get(local_368);
    std::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
              ((pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                *)&local_4c8,(shared_ptr<const_mathiu::impl::Expr> *)__a,
               &(pPVar9->super_ExprPtrPair).second);
    __l._M_len = 1;
    __l._M_array = (pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                    *)&local_4c8;
    std::
    map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           *)local_3f0,__l,(ExprPtrLess *)&local_448,(allocator_type *)&local_4e8);
    std::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::~pair((pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
             *)&local_4c8);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::operator=(&local_428,
                (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                 *)local_3f0);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                 *)local_3f0);
  }
  else {
    ppeVar3 = (element_type **)(local_3f0 + 8);
    local_3f0._8_4_ = _S_red;
    local_3e0 = (_Base_ptr)0x0;
    local_3c8 = 0;
    local_3d8 = (_Base_ptr)ppeVar3;
    local_3d0 = (_Base_ptr)ppeVar3;
    pSVar6 = matchit::impl::Id<mathiu::impl::Set>::get(local_2f8);
    p_Var8 = (pSVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pSVar6 = matchit::impl::Id<mathiu::impl::Set>::get(local_2f8);
    local_250.container =
         (map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
          *)local_3f0;
    local_250.iter._M_node = (_Base_ptr)ppeVar3;
    for (; (_Rb_tree_header *)p_Var8 !=
           &(pSVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      ppVar7 = &std::
                get<17ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                          (*(variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                             **)(p_Var8 + 1))->super_ExprPtrPair;
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      pair(&local_4c8,ppVar7);
      local_4e8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_4c8.first.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_4e8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_4c8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_4c8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_4c8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4e8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_4c8.second.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_4e8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_4c8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_4c8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_4c8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      ~pair(&local_4c8);
      local_448.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_4e8.first.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_448.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_4e8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_4e8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_4e8.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_448.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_4e8.second.
               super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_448.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_4e8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_4e8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_4e8.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      insert_iterator<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
      ::operator=(&local_250,&local_448);
      std::
      pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
      ::~pair(&local_448);
      std::
      pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>::
      ~pair(&local_4e8);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::operator=(&local_428,
                (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                 *)local_3f0);
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                 *)local_3f0);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&subMap._M_t._M_impl.super__Rb_tree_header,&local_428._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_428);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)((long)&local_3c0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)((long)&local_158.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)((long)&local_1b0.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage(&local_2c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_360.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_98.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)((long)&local_100.mPattern.mPatterns.
                                 super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                 .
                                 super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                         + 8));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage(&local_240);
  substituteImpl((ExprPtr *)this,(ExprPtrMap *)ex);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&subMap._M_t);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                       *)&iPair);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                       *)&iSet);
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar10.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr substitute(ExprPtr const &ex, ExprPtr const &srcDstPairs)
    {
#if VERBOSE_DEBUG
        std::cout << "substitute: " << toString(ex) << " " << toString(srcDstPairs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Set> iSet;
        Id<Pair> iPair;
        auto const subMap = match(*srcDstPairs)(
            pattern | as<Set>(iSet) = [&]
            {
                ExprPtrMap result;
                std::transform((*iSet).begin(), (*iSet).end(), std::inserter(result, result.end()), [&](auto &&e)
                               {
                                   auto pair = std::get<Pair>(*e);
                                   return pair;
                               });
                return result;
            },
            pattern | as<Pair>(iPair) = [&]
            { return ExprPtrMap{{{(*iPair).first, (*iPair).second}}}; },
            pattern | _ = [&]
            {
                throw std::runtime_error("Mismatch in substitute!");
                return ExprPtrMap{};
            });
        return substituteImpl(ex, subMap);
    }